

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

int trex_newnode(TRex *exp,TRexNodeType type)

{
  int iVar1;
  TRexNode *pTVar2;
  int iVar3;
  int iVar4;
  
  if (type == 0x102) {
    iVar4 = exp->_nsubexpr;
    exp->_nsubexpr = iVar4 + 1;
  }
  else {
    iVar4 = -1;
  }
  iVar1 = exp->_nallocated;
  iVar3 = exp->_nsize;
  if (iVar3 < iVar1) {
    pTVar2 = exp->_nodes;
  }
  else {
    exp->_nallocated = iVar1 * 2;
    pTVar2 = (TRexNode *)realloc(exp->_nodes,(long)iVar1 << 5);
    exp->_nodes = pTVar2;
    iVar3 = exp->_nsize;
  }
  exp->_nsize = iVar3 + 1;
  pTVar2[iVar3].type = type;
  pTVar2[iVar3].left = -1;
  pTVar2[iVar3].right = iVar4;
  pTVar2[iVar3].next = -1;
  return exp->_nsize + -1;
}

Assistant:

static int trex_newnode(TRex * exp, TRexNodeType type) {
	TRexNode n;
	int newid;
	n.type = type;
	n.next = n.right = n.left = -1;

	if (type == OP_EXPR) {
		n.right = exp->_nsubexpr++;
	}

	if (exp->_nallocated < (exp->_nsize + 1)) {
		exp->_nallocated *= 2;
		exp->_nodes = (TRexNode *)realloc(exp->_nodes, exp->_nallocated * sizeof(TRexNode));
	}

	exp->_nodes[exp->_nsize++] = n;
	newid = exp->_nsize - 1;
	return (int)newid;
}